

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O0

entry * libtorrent::write_resume_data(entry *__return_storage_ptr__,add_torrent_params *atp)

{
  integer_type iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  entry *peVar5;
  char *pcVar6;
  ulong uVar7;
  element_type *peVar8;
  vector<char,std::allocator<char>> *this;
  char *pcVar9;
  string *psVar10;
  time_t tVar11;
  string_type *psVar12;
  void *__dest;
  const_reference __src;
  size_type sVar13;
  list_type *plVar14;
  size_type __n;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>_>
  *this_00;
  noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  reference piVar15;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar16;
  int *piVar17;
  undefined8 uVar18;
  byte *pbVar19;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_02;
  reference this_03;
  reference pvVar20;
  noexcept_movable<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  *pnVar21;
  noexcept_movable<std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *pnVar22;
  reference psVar23;
  const_iterator cVar24;
  strong_typedef local_7a1;
  const_iterator cStack_7a0;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> p_4;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  noexcept_movable<std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *__range2_6;
  string_type *local_778;
  string_type *prio_1;
  const_iterator cStack_768;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> p_3;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  noexcept_movable<std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *__range2_5;
  list_type *local_740;
  list_type *prio;
  undefined8 local_728;
  unsigned_long local_720;
  unsigned_long local_718;
  string_view local_710;
  undefined8 local_700;
  unsigned_long local_6f8;
  unsigned_long local_6f0;
  string_view local_6e8;
  undefined8 local_6d8;
  unsigned_long local_6d0;
  unsigned_long local_6c8;
  string_view local_6c0;
  string_view local_6b0;
  string_view local_6a0;
  string_view local_690;
  basic_endpoint<boost::asio::ip::tcp> *local_680;
  basic_endpoint<boost::asio::ip::tcp> *p_2;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  noexcept_movable<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  *__range2_4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr6_1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr_1;
  basic_endpoint<boost::asio::ip::tcp> *p_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  noexcept_movable<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  *__range2_3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr6;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr;
  size_t idx;
  pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ent;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2_2;
  list_type *local_588;
  list_type *fl;
  uint32_t *puStack_578;
  bool bit_1;
  uint32_t local_570;
  undefined1 local_568 [8];
  const_iterator __end1_1;
  undefined1 local_548 [8];
  const_iterator __begin1_1;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range1_1;
  bool bit;
  undefined1 local_518 [8];
  const_iterator __end1;
  undefined1 local_4f8 [8];
  const_iterator __begin1;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range1;
  size_t piece;
  string_view local_4d0;
  string_type *local_4c0;
  string_type *pieces;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_4b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a0;
  string_view local_498;
  list_type *local_488;
  list_type *httpseeds_list;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_478;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  string_view local_460;
  list_type *local_450;
  list_type *url_list;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_440;
  reference local_438;
  string *tr;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  const_iterator tier_it;
  size_t tier;
  pointer peStack_400;
  pointer local_3f8;
  string_view local_3f0;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_3e0;
  list_type *tr_list;
  allocator local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string_view local_3a0;
  undefined1 local_390 [8];
  entry piece_struct;
  pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>
  *p;
  const_iterator __end2;
  const_iterator __begin2;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>_>
  *__range2;
  list_type *local_328;
  list_type *up;
  noexcept_movable<std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  *tree;
  string_type *local_308;
  string *tree_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string_view local_2d0;
  string_view local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string_view local_290;
  int local_27c;
  undefined1 local_278 [4];
  int size;
  shared_array<char> info;
  span<const_char> local_258;
  string_view local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string_view local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string_view local_1b8;
  string_view local_1a8;
  string_view local_198;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  string_view local_170;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  string_view local_148;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e0;
  string_view local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50 [2];
  string_view local_30;
  undefined1 local_19;
  add_torrent_params *local_18;
  add_torrent_params *atp_local;
  entry *ret;
  
  local_19 = 0;
  local_18 = atp;
  atp_local = (add_torrent_params *)__return_storage_ptr__;
  entry::entry(__return_storage_ptr__);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"file-format");
  peVar5 = entry::operator[](__return_storage_ptr__,local_30);
  entry::operator=(peVar5,"libtorrent resume file");
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_50,"file-version");
  peVar5 = entry::operator[](__return_storage_ptr__,local_50[0]);
  entry::operator=(peVar5,1);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"libtorrent-version");
  peVar5 = entry::operator[](__return_storage_ptr__,local_60);
  entry::operator=(peVar5,"1.2.6.0");
  pcVar6 = "sparse";
  if (local_18->storage_mode == storage_mode_allocate) {
    pcVar6 = "allocate";
  }
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"allocation")
  ;
  peVar5 = entry::operator[](__return_storage_ptr__,local_70);
  entry::operator=(peVar5,pcVar6);
  iVar1 = local_18->total_uploaded;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,"total_uploaded");
  peVar5 = entry::operator[](__return_storage_ptr__,local_80);
  entry::operator=(peVar5,iVar1);
  iVar1 = local_18->total_downloaded;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"total_downloaded");
  peVar5 = entry::operator[](__return_storage_ptr__,local_90);
  entry::operator=(peVar5,iVar1);
  iVar4 = local_18->active_time;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a0,"active_time");
  peVar5 = entry::operator[](__return_storage_ptr__,local_a0);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->finished_time;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"finished_time");
  peVar5 = entry::operator[](__return_storage_ptr__,local_b0);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->seeding_time;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_c0,"seeding_time");
  peVar5 = entry::operator[](__return_storage_ptr__,(string_view)local_c0);
  entry::operator=(peVar5,(long)iVar4);
  iVar1 = local_18->last_seen_complete;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,"last_seen_complete");
  peVar5 = entry::operator[](__return_storage_ptr__,local_d0);
  entry::operator=(peVar5,iVar1);
  iVar1 = local_18->last_download;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_e0,"last_download");
  peVar5 = entry::operator[](__return_storage_ptr__,(string_view)local_e0);
  entry::operator=(peVar5,iVar1);
  iVar1 = local_18->last_upload;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"last_upload");
  peVar5 = entry::operator[](__return_storage_ptr__,local_f0);
  entry::operator=(peVar5,iVar1);
  iVar4 = local_18->num_complete;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"num_complete");
  peVar5 = entry::operator[](__return_storage_ptr__,local_100);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->num_incomplete;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"num_incomplete");
  peVar5 = entry::operator[](__return_storage_ptr__,local_110);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->num_downloaded;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,"num_downloaded");
  peVar5 = entry::operator[](__return_storage_ptr__,local_120);
  entry::operator=(peVar5,(long)iVar4);
  local_130 = (pointer)(local_18->flags).m_val;
  local_138 = (pointer)0x200;
  local_128 = (pointer)flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )local_130,
                                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )0x200);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_128);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"sequential_download");
  peVar5 = entry::operator[](__return_storage_ptr__,local_148);
  entry::operator=(peVar5,(ulong)bVar3);
  local_158 = (pointer)(local_18->flags).m_val;
  local_160 = (pointer)0x1;
  local_150 = (pointer)flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )local_158,
                                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )0x1);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_150);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"seed_mode")
  ;
  peVar5 = entry::operator[](__return_storage_ptr__,local_170);
  entry::operator=(peVar5,(ulong)bVar3);
  local_180 = (pointer)(local_18->flags).m_val;
  local_188 = (pointer)0x100;
  local_178 = (pointer)flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )local_180,
                                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                         )0x100);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_178);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,"super_seeding");
  peVar5 = entry::operator[](__return_storage_ptr__,local_198);
  entry::operator=(peVar5,(ulong)bVar3);
  iVar1 = local_18->added_time;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,"added_time");
  peVar5 = entry::operator[](__return_storage_ptr__,local_1a8);
  entry::operator=(peVar5,iVar1);
  iVar1 = local_18->completed_time;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,"completed_time");
  peVar5 = entry::operator[](__return_storage_ptr__,local_1b8);
  entry::operator=(peVar5,iVar1);
  std::__cxx11::string::string((string *)&local_1d8,(string *)&local_18->save_path);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e8,"save_path");
  peVar5 = entry::operator[](__return_storage_ptr__,(string_view)local_1e8);
  entry::operator=(peVar5,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_208,(string *)&local_18->url);
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_218,"url");
    peVar5 = entry::operator[](__return_storage_ptr__,local_218);
    entry::operator=(peVar5,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_238,(string *)&local_18->uuid);
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"uuid");
    peVar5 = entry::operator[](__return_storage_ptr__,local_248);
    entry::operator=(peVar5,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  span<char_const>::span<libtorrent::digest32<160l>,char,void>
            ((span<char_const> *)&local_258,&local_18->info_hash);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&info.pn,"info-hash");
  peVar5 = entry::operator[](__return_storage_ptr__,stack0xfffffffffffffd98);
  entry::operator=(peVar5,local_258);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->ti);
  if (bVar3) {
    std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_18->ti);
    torrent_info::metadata((torrent_info *)local_278);
    peVar8 = std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_18->ti);
    local_27c = torrent_info::metadata_size(peVar8);
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"info");
    peVar5 = entry::operator[](__return_storage_ptr__,local_290);
    this = (vector<char,std::allocator<char>> *)entry::preformatted(peVar5);
    pcVar6 = boost::shared_array<char>::operator[]((shared_array<char> *)local_278,0);
    pcVar9 = boost::shared_array<char>::operator[]((shared_array<char> *)local_278,0);
    std::vector<char,std::allocator<char>>::assign<char*,void>(this,pcVar6,pcVar9 + local_27c);
    peVar8 = std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_18->ti);
    torrent_info::comment_abi_cxx11_(peVar8);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      peVar8 = std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_18->ti);
      psVar10 = torrent_info::comment_abi_cxx11_(peVar8);
      std::__cxx11::string::string((string *)&local_2b0,(string *)psVar10);
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2c0,"comment");
      peVar5 = entry::operator[](__return_storage_ptr__,local_2c0);
      entry::operator=(peVar5,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    peVar8 = std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_18->ti);
    tVar11 = torrent_info::creation_date(peVar8);
    if (tVar11 != 0) {
      peVar8 = std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_18->ti);
      tVar11 = torrent_info::creation_date(peVar8);
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2d0,"creation date");
      peVar5 = entry::operator[](__return_storage_ptr__,local_2d0);
      entry::operator=(peVar5,tVar11);
    }
    peVar8 = std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_18->ti);
    torrent_info::creator_abi_cxx11_(peVar8);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      peVar8 = std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_18->ti);
      psVar10 = torrent_info::creator_abi_cxx11_(peVar8);
      std::__cxx11::string::string((string *)&local_2f0,(string *)psVar10);
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&tree_str,"created by");
      peVar5 = entry::operator[](__return_storage_ptr__,_tree_str);
      entry::operator=(peVar5,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    boost::shared_array<char>::~shared_array((shared_array<char> *)local_278);
  }
  bVar3 = std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          empty(&(local_18->merkle_tree).
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&tree,"merkle tree");
    peVar5 = entry::operator[](__return_storage_ptr__,_tree);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    up = (list_type *)&local_18->merkle_tree;
    local_308 = psVar12;
    std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::size
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               up);
    std::__cxx11::string::resize((ulong)psVar12);
    __dest = (void *)std::__cxx11::string::operator[]((ulong)local_308);
    __src = std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
            operator[]((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        *)up,0);
    sVar13 = std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
             size((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)up);
    memcpy(__dest,__src,sVar13 * 0x14);
  }
  bVar3 = std::
          map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
          ::empty(&(local_18->unfinished_pieces).
                   super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"unfinished");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2);
    plVar14 = entry::list(peVar5);
    local_328 = plVar14;
    __n = std::
          map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
          ::size(&(local_18->unfinished_pieces).
                  super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                );
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve(plVar14,__n);
    this_00 = &local_18->unfinished_pieces;
    __end2 = std::
             map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
             ::begin(&this_00->
                      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                    );
    p = (pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>
         *)std::
           map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
           ::end(&this_00->
                  super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                );
    while (bVar3 = std::operator!=(&__end2,(_Self *)&p), bVar3) {
      piece_struct._48_8_ =
           std::
           _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>
           ::operator*(&__end2);
      entry::entry((entry *)local_390,dictionary_t);
      iVar4 = aux::strong_typedef::operator_cast_to_int((strong_typedef *)piece_struct._48_8_);
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a0,"piece")
      ;
      peVar5 = entry::operator[]((entry *)local_390,local_3a0);
      entry::operator=(peVar5,(long)iVar4);
      pcVar6 = bitfield::data((bitfield *)(piece_struct._48_8_ + 8));
      iVar4 = bitfield::size((bitfield *)(piece_struct._48_8_ + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3c0,pcVar6,(ulong)(long)(iVar4 + 7) >> 3,&local_3c1);
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&tr_list,"bitmask");
      peVar5 = entry::operator[]((entry *)local_390,_tr_list);
      entry::operator=(peVar5,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::push_back
                (local_328,(value_type *)local_390);
      entry::~entry((entry *)local_390);
      std::
      _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>
      ::operator++(&__end2);
    }
  }
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f0,"trackers");
  peVar5 = entry::operator[](__return_storage_ptr__,local_3f0);
  local_3e0 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar5);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(local_18->trackers).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  pvVar16 = local_3e0;
  if (!bVar3) {
    tier = 0;
    peStack_400 = (pointer)0x0;
    local_3f8 = (pointer)0x0;
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              (pvVar16,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    tier_it._M_current = (int *)0x0;
    __range2_1 = (noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)std::vector<int,_std::allocator<int>_>::begin
                              (&(local_18->tracker_tiers).super_vector<int,_std::allocator<int>_>);
    this_01 = &local_18->trackers;
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this_01->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
    tr = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this_01->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&tr), bVar3) {
      local_438 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      local_440._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            (&(local_18->tracker_tiers).super_vector<int,_std::allocator<int>_>);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &__range2_1,&local_440);
      if (bVar3) {
        url_list = (list_type *)
                   __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&__range2_1,0);
        piVar15 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&url_list);
        tier_it._M_current = (int *)aux::clamp<unsigned_long>((long)*piVar15,0,0x400);
      }
      piVar17 = (int *)std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::size
                                 ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                                  local_3e0);
      if (piVar17 <= tier_it._M_current) {
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_3e0,
                   (long)tier_it._M_current + 1);
      }
      pvVar20 = std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_3e0,(size_type)tier_it._M_current);
      pvVar16 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(pvVar20);
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(pvVar16,local_438);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_460,"url-list");
  peVar5 = entry::operator[](__return_storage_ptr__,local_460);
  local_450 = entry::list(peVar5);
  local_468._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&(local_18->url_seeds).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  local_470._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&(local_18->url_seeds).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  local_478 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
              std::back_inserter<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                        (local_450);
  httpseeds_list =
       (list_type *)
       std::
       copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
                 (local_468,local_470,
                  (back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                   )local_478);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_498,"httpseeds")
  ;
  peVar5 = entry::operator[](__return_storage_ptr__,local_498);
  local_488 = entry::list(peVar5);
  local_4a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&(local_18->http_seeds).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  local_4a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&(local_18->http_seeds).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  local_4b0 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
              std::back_inserter<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                        (local_488);
  pieces = (string_type *)
           std::
           copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
                     (local_4a0,local_4a8,
                      (back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                       )local_4b0);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d0,"pieces");
  peVar5 = entry::operator[](__return_storage_ptr__,local_4d0);
  psVar12 = entry::string_abi_cxx11_(peVar5);
  local_4c0 = psVar12;
  piece._4_4_ = bitfield::size(&(local_18->have_pieces).super_bitfield);
  piece._0_4_ = bitfield::size(&(local_18->verified_pieces).super_bitfield);
  piVar17 = std::max<int>((int *)((long)&piece + 4),(int *)&piece);
  aux::numeric_cast<unsigned_long,int,void>(*piVar17);
  std::__cxx11::string::resize((ulong)psVar12);
  __begin1._8_8_ = &local_18->have_pieces;
  cVar24 = bitfield::begin((bitfield *)__begin1._8_8_);
  __end1._8_8_ = cVar24.buf;
  __begin1.buf._0_4_ = cVar24.bit;
  local_4f8 = (undefined1  [8])__end1._8_8_;
  cVar24 = bitfield::end((bitfield *)__begin1._8_8_);
  local_518 = (undefined1  [8])cVar24.buf;
  __end1.buf._0_4_ = cVar24.bit;
  while (bVar3 = bitfield::const_iterator::operator!=
                           ((const_iterator *)local_4f8,(const_iterator *)local_518), bVar3) {
    bVar3 = bitfield::const_iterator::operator*((const_iterator *)local_4f8);
    uVar18 = std::__cxx11::string::operator[]((ulong)local_4c0);
    *(bool *)uVar18 = bVar3;
    bitfield::const_iterator::operator++((const_iterator *)local_4f8);
  }
  __begin1_1._8_8_ = &local_18->verified_pieces;
  cVar24 = bitfield::begin((bitfield *)__begin1_1._8_8_);
  __end1_1._8_8_ = cVar24.buf;
  __begin1_1.buf._0_4_ = cVar24.bit;
  local_548 = (undefined1  [8])__end1_1._8_8_;
  cVar24 = bitfield::end((bitfield *)__begin1_1._8_8_);
  puStack_578 = cVar24.buf;
  local_570 = cVar24.bit;
  local_568 = (undefined1  [8])puStack_578;
  __end1_1.buf._0_4_ = local_570;
  while (bVar3 = bitfield::const_iterator::operator!=
                           ((const_iterator *)local_548,(const_iterator *)local_568), bVar3) {
    fl._7_1_ = bitfield::const_iterator::operator*((const_iterator *)local_548);
    bVar2 = fl._7_1_ * '\x02';
    pbVar19 = (byte *)std::__cxx11::string::operator[]((ulong)local_4c0);
    *pbVar19 = *pbVar19 | bVar2;
    bitfield::const_iterator::operator++((const_iterator *)local_548);
  }
  bVar3 = std::
          map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&(local_18->renamed_files).
                   super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_2,"mapped_files");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2_2);
    local_588 = entry::list(peVar5);
    this_02 = &local_18->renamed_files;
    __end2_2 = std::
               map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&this_02->
                        super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      );
    ent = (pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this_02->
                    super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  );
    while (bVar3 = std::operator!=(&__end2_2,(_Self *)&ent), bVar3) {
      this_03 = std::
                _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end2_2);
      iVar4 = aux::strong_typedef::operator_cast_to_int((strong_typedef *)this_03);
      uVar7 = (ulong)iVar4;
      sVar13 = std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::size(local_588);
      if (sVar13 <= uVar7) {
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  (local_588,uVar7 + 1);
      }
      std::__cxx11::string::string((string *)&ptr,(string *)&this_03->second);
      pvVar20 = std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          (local_588,uVar7);
      entry::operator=(pvVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ptr);
      std::__cxx11::string::~string((string *)&ptr);
      std::
      _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_2);
    }
  }
  bVar3 = std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::empty(&(local_18->peers).
                   super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&ptr6,"peers");
    peVar5 = entry::operator[](__return_storage_ptr__,_ptr6);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&local_5e8,psVar12);
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_3,"peers6");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2_3);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&local_600,psVar12);
    pnVar21 = &local_18->peers;
    __end2_3 = std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin(&pnVar21->
                        super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                      );
    p_1 = (basic_endpoint<boost::asio::ip::tcp> *)
          std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::end(&pnVar21->
                 super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               );
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                               *)&p_1), bVar3) {
      ptr_1.container =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __gnu_cxx::
           __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
           ::operator*(&__end2_3);
      bVar3 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                        ((basic_endpoint<boost::asio::ip::tcp> *)ptr_1.container);
      if (bVar3) {
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)ptr_1.container,&local_600);
      }
      else {
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)ptr_1.container,&local_5e8);
      }
      __gnu_cxx::
      __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
      ::operator++(&__end2_3);
    }
  }
  bVar3 = std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::empty(&(local_18->banned_peers).
                   super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&ptr6_1,"banned_peers");
    peVar5 = entry::operator[](__return_storage_ptr__,_ptr6_1);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&local_638,psVar12);
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_4,"banned_peers6");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2_4);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&local_650,psVar12);
    pnVar21 = &local_18->banned_peers;
    __end2_4 = std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin(&pnVar21->
                        super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                      );
    p_2 = (basic_endpoint<boost::asio::ip::tcp> *)
          std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::end(&pnVar21->
                 super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               );
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                               *)&p_2), bVar3) {
      local_680 = __gnu_cxx::
                  __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                  ::operator*(&__end2_4);
      bVar3 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(local_680);
      if (bVar3) {
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  (local_680,&local_650);
      }
      else {
        detail::
        write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                  (local_680,&local_638);
      }
      __gnu_cxx::
      __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
      ::operator++(&__end2_4);
    }
  }
  iVar4 = local_18->upload_limit;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_690,"upload_rate_limit");
  peVar5 = entry::operator[](__return_storage_ptr__,local_690);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->download_limit;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6a0,"download_rate_limit");
  peVar5 = entry::operator[](__return_storage_ptr__,local_6a0);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->max_connections;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6b0,"max_connections");
  peVar5 = entry::operator[](__return_storage_ptr__,local_6b0);
  entry::operator=(peVar5,(long)iVar4);
  iVar4 = local_18->upload_limit;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6c0,"max_uploads");
  peVar5 = entry::operator[](__return_storage_ptr__,local_6c0);
  entry::operator=(peVar5,(long)iVar4);
  local_6d0 = (local_18->flags).m_val;
  local_6d8 = 0x10;
  local_6c8 = (unsigned_long)
              flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               local_6d0,
                               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               0x10);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_6c8);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6e8,"paused");
  peVar5 = entry::operator[](__return_storage_ptr__,local_6e8);
  entry::operator=(peVar5,(ulong)bVar3);
  local_6f8 = (local_18->flags).m_val;
  local_700 = 0x20;
  local_6f0 = (unsigned_long)
              flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               local_6f8,
                               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               0x20);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_6f0);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_710,"auto_managed");
  peVar5 = entry::operator[](__return_storage_ptr__,local_710);
  entry::operator=(peVar5,(ulong)bVar3);
  local_720 = (local_18->flags).m_val;
  local_728 = 0x400;
  local_718 = (unsigned_long)
              flags::operator&((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               local_720,
                               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                               0x400);
  bVar3 = flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_718);
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&prio,"stop_when_ready");
  peVar5 = entry::operator[](__return_storage_ptr__,_prio);
  entry::operator=(peVar5,(ulong)bVar3);
  bVar3 = std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::empty(&(local_18->file_priorities).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_5,"file_priority");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2_5);
    plVar14 = entry::list(peVar5);
    local_740 = plVar14;
    sVar13 = std::
             vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ::size(&(local_18->file_priorities).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   );
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve(plVar14,sVar13);
    pnVar22 = &local_18->file_priorities;
    __end2_5 = std::
               vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ::begin(&pnVar22->
                        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      );
    cStack_768 = std::
                 vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ::end(&pnVar22->
                        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      );
    while (bVar3 = __gnu_cxx::operator!=(&__end2_5,&stack0xfffffffffffff898), bVar3) {
      psVar23 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                ::operator*(&__end2_5);
      plVar14 = local_740;
      prio_1._7_1_ = psVar23->m_val;
      prio_1._6_1_ = aux::strong_typedef::operator_cast_to_unsigned_char
                               ((strong_typedef *)((long)&prio_1 + 7));
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
      emplace_back<unsigned_char>(plVar14,(uchar *)((long)&prio_1 + 6));
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::operator++(&__end2_5);
    }
  }
  bVar3 = std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::empty(&(local_18->piece_priorities).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 );
  if (!bVar3) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_6,"piece_priority");
    peVar5 = entry::operator[](__return_storage_ptr__,___range2_6);
    psVar12 = entry::string_abi_cxx11_(peVar5);
    local_778 = psVar12;
    std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::size(&(local_18->piece_priorities).
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          );
    std::__cxx11::string::reserve((ulong)psVar12);
    pnVar22 = &local_18->piece_priorities;
    __end2_6 = std::
               vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ::begin(&pnVar22->
                        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      );
    cStack_7a0 = std::
                 vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ::end(&pnVar22->
                        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      );
    while (bVar3 = __gnu_cxx::operator!=(&__end2_6,&stack0xfffffffffffff860), bVar3) {
      psVar23 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                ::operator*(&__end2_6);
      psVar12 = local_778;
      local_7a1 = (strong_typedef)psVar23->m_val;
      aux::strong_typedef::operator_cast_to_unsigned_char(&local_7a1);
      std::__cxx11::string::push_back((char)psVar12);
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::operator++(&__end2_6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_resume_data(add_torrent_params const& atp)
	{
		entry ret;

		using namespace libtorrent::detail; // for write_*_endpoint()
		ret["file-format"] = "libtorrent resume file";
		ret["file-version"] = 1;
		ret["libtorrent-version"] = LIBTORRENT_VERSION;
		ret["allocation"] = atp.storage_mode == storage_mode_allocate
			? "allocate" : "sparse";

		ret["total_uploaded"] = atp.total_uploaded;
		ret["total_downloaded"] = atp.total_downloaded;

		// cast to seconds in case that internal values doesn't have ratio<1>
		ret["active_time"] = atp.active_time;
		ret["finished_time"] = atp.finished_time;
		ret["seeding_time"] = atp.seeding_time;
		ret["last_seen_complete"] = atp.last_seen_complete;
		ret["last_download"] = atp.last_download;
		ret["last_upload"] = atp.last_upload;

		ret["num_complete"] = atp.num_complete;
		ret["num_incomplete"] = atp.num_incomplete;
		ret["num_downloaded"] = atp.num_downloaded;

		ret["sequential_download"] = bool(atp.flags & torrent_flags::sequential_download);

		ret["seed_mode"] = bool(atp.flags & torrent_flags::seed_mode);
		ret["super_seeding"] = bool(atp.flags & torrent_flags::super_seeding);

		ret["added_time"] = atp.added_time;
		ret["completed_time"] = atp.completed_time;

		ret["save_path"] = atp.save_path;

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		if (!atp.url.empty()) ret["url"] = atp.url;
		if (!atp.uuid.empty()) ret["uuid"] = atp.uuid;
#endif

		ret["info-hash"] = atp.info_hash;

		if (atp.ti)
		{
			auto const info = atp.ti->metadata();
			int const size = atp.ti->metadata_size();
			ret["info"].preformatted().assign(&info[0], &info[0] + size);
			if (!atp.ti->comment().empty())
				ret["comment"] = atp.ti->comment();
			if (atp.ti->creation_date() != 0)
				ret["creation date"] = atp.ti->creation_date();
			if (!atp.ti->creator().empty())
				ret["created by"] = atp.ti->creator();
		}

		if (!atp.merkle_tree.empty())
		{
			// we need to save the whole merkle hash tree
			// in order to resume
			std::string& tree_str = ret["merkle tree"].string();
			auto const& tree = atp.merkle_tree;
			tree_str.resize(tree.size() * 20);
			std::memcpy(&tree_str[0], &tree[0], tree.size() * 20);
		}

		if (!atp.unfinished_pieces.empty())
		{
			entry::list_type& up = ret["unfinished"].list();
			up.reserve(atp.unfinished_pieces.size());

			// info for each unfinished piece
			for (auto const& p : atp.unfinished_pieces)
			{
				entry piece_struct(entry::dictionary_t);

				// the unfinished piece's index
				piece_struct["piece"] = static_cast<int>(p.first);
				piece_struct["bitmask"] = std::string(p.second.data(), std::size_t(p.second.size() + 7) / 8);
				// push the struct onto the unfinished-piece list
				up.push_back(std::move(piece_struct));
			}
		}

		// save trackers
		entry::list_type& tr_list = ret["trackers"].list();
		if (!atp.trackers.empty())
		{
			tr_list.emplace_back(entry::list_type());
			std::size_t tier = 0;
			auto tier_it = atp.tracker_tiers.begin();
			for (std::string const& tr : atp.trackers)
			{
				if (tier_it != atp.tracker_tiers.end())
					tier = aux::clamp(std::size_t(*tier_it++), std::size_t{0}, std::size_t{1024});

				if (tr_list.size() <= tier)
					tr_list.resize(tier + 1);

				tr_list[tier].list().emplace_back(tr);
			}
		}

		// save web seeds
		entry::list_type& url_list = ret["url-list"].list();
		std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));

		entry::list_type& httpseeds_list = ret["httpseeds"].list();
		std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));

		// write have bitmask
		entry::string_type& pieces = ret["pieces"].string();
		pieces.resize(aux::numeric_cast<std::size_t>(std::max(
			atp.have_pieces.size(), atp.verified_pieces.size())));

		std::size_t piece(0);
		for (auto const bit : atp.have_pieces)
		{
			pieces[piece] = bit ? 1 : 0;
			++piece;
		}

		piece = 0;
		for (auto const bit : atp.verified_pieces)
		{
			pieces[piece] |= bit ? 2 : 0;
			++piece;
		}

		// write renamed files
		if (!atp.renamed_files.empty())
		{
			entry::list_type& fl = ret["mapped_files"].list();
			for (auto const& ent : atp.renamed_files)
			{
				std::size_t const idx(static_cast<std::size_t>(static_cast<int>(ent.first)));
				if (idx >= fl.size()) fl.resize(idx + 1);
				fl[idx] = ent.second;
			}
		}

		// write local peers
		if (!atp.peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["peers6"].string());
			for (auto const& p : atp.peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		if (!atp.banned_peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["banned_peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["banned_peers6"].string());
			for (auto const& p : atp.banned_peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		ret["upload_rate_limit"] = atp.upload_limit;
		ret["download_rate_limit"] = atp.download_limit;
		ret["max_connections"] = atp.max_connections;
		ret["max_uploads"] = atp.upload_limit;
		ret["paused"] = bool(atp.flags & torrent_flags::paused);
		ret["auto_managed"] = bool(atp.flags & torrent_flags::auto_managed);
		ret["stop_when_ready"] = bool(atp.flags & torrent_flags::stop_when_ready);

		if (!atp.file_priorities.empty())
		{
			// write file priorities
			entry::list_type& prio = ret["file_priority"].list();
			prio.reserve(atp.file_priorities.size());
			for (auto const p : atp.file_priorities)
				prio.emplace_back(static_cast<std::uint8_t>(p));
		}

		if (!atp.piece_priorities.empty())
		{
			// write piece priorities
			entry::string_type& prio = ret["piece_priority"].string();
			prio.reserve(atp.piece_priorities.size());
			for (auto const p : atp.piece_priorities)
				prio.push_back(static_cast<char>(static_cast<std::uint8_t>(p)));
		}

		return ret;
	}